

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

void __thiscall icu_63::Formattable::Formattable(Formattable *this,int32_t value)

{
  int32_t iVar1;
  undefined4 in_register_00000034;
  int32_t value_local;
  Formattable *this_local;
  
  iVar1 = value;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_005ba5d0;
  icu_63::UnicodeString::UnicodeString(&this->fBogus);
  init(this,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,iVar1));
  *(long *)&this->fValue = (long)value;
  return;
}

Assistant:

Formattable::Formattable(int32_t value)
{
    init();
    fValue.fInt64 = value;
}